

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O0

void __thiscall TRM::Bitmap::ReadFromFile(Bitmap *this,char *filename)

{
  stbi_uc *psVar1;
  array<unsigned_char,_4UL> *paVar2;
  pointer __dest;
  reference pvVar3;
  reference pvVar4;
  array<unsigned_char,_4UL> local_3c;
  int local_38;
  Color color;
  int j;
  int i;
  uchar *data;
  uint32_t local_20;
  int n;
  int y;
  int x;
  char *filename_local;
  Bitmap *this_local;
  
  _y = filename;
  filename_local = (char *)this;
  psVar1 = stbi_load(filename,&n,(int *)&local_20,(int *)((long)&data + 4),0);
  std::vector<TRM::Color,_std::allocator<TRM::Color>_>::resize
            (&this->fPixels,(long)(int)(n * local_20));
  for (color.fRGBA._M_elems = (array<unsigned_char,_4UL>)(_Type)0x0; (int)color.fRGBA._M_elems < n;
      color.fRGBA._M_elems = (array<unsigned_char,_4UL>)((int)color.fRGBA._M_elems + 1)) {
    for (local_38 = 0; local_38 < (int)local_20; local_38 = local_38 + 1) {
      Color::Color((Color *)&local_3c);
      paVar2 = Color::rgba((Color *)&local_3c);
      __dest = std::array<unsigned_char,_4UL>::data(paVar2);
      memcpy(__dest,psVar1 + (local_38 * n + (int)color.fRGBA._M_elems) * data._4_4_,
             (long)data._4_4_);
      if (data._4_4_ < 4) {
        paVar2 = Color::rgba((Color *)&local_3c);
        pvVar3 = std::array<unsigned_char,_4UL>::operator[](paVar2,3);
        *pvVar3 = 0xff;
      }
      pvVar4 = std::vector<TRM::Color,_std::allocator<TRM::Color>_>::operator[]
                         (&this->fPixels,(long)(local_38 * n + (int)color.fRGBA._M_elems));
      *&(pvVar4->fRGBA)._M_elems = local_3c._M_elems;
    }
  }
  this->fWidth = n;
  this->fHeight = local_20;
  return;
}

Assistant:

void Bitmap::ReadFromFile(const char *filename) {
  int x, y, n;
  unsigned char *data = stbi_load(filename, &x, &y, &n, 0);
  fPixels.resize(x * y);
  for (int i = 0; i < x; i++) {
    for (int j = 0; j < y; j++) {
      Color color;
      std::memcpy(color.rgba().data(), data + (j * x + i) * n, n);
      if (n < 4) {
        color.rgba()[3] = 255;
      }
      fPixels[j * x + i] = color;
    }
  }

  fWidth = x;
  fHeight = y;
}